

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void nukedopn2_reset_chip(void *chip)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Bit32u filter;
  Bit32u type;
  UINT32 mute;
  DEV_DATA devData;
  Bit32u i;
  ym3438_t *opn2;
  void *chip_local;
  
  uVar3 = *chip;
  filter = 0;
  for (devData.chipInf._4_4_ = 0; devData.chipInf._4_4_ < 7;
      devData.chipInf._4_4_ = devData.chipInf._4_4_ + 1) {
    filter = *(int *)((long)chip + (ulong)devData.chipInf._4_4_ * 4 + 0x4fc) <<
             ((byte)devData.chipInf._4_4_ & 0x1f) | filter;
  }
  uVar1 = *(undefined4 *)((long)chip + 0x4f4);
  uVar2 = *(undefined4 *)((long)chip + 0x4f8);
  NOPN2_Reset((ym3438_t *)chip,*(Bit32u *)((long)chip + 8),*(Bit32u *)((long)chip + 0xc));
  *(undefined8 *)chip = uVar3;
  nukedopn2_set_mute_mask(chip,filter);
  *(undefined4 *)((long)chip + 0x4f4) = uVar1;
  *(undefined4 *)((long)chip + 0x4f8) = uVar2;
  return;
}

Assistant:

void nukedopn2_reset_chip(void *chip)
{
    ym3438_t* opn2 = (ym3438_t*)chip;
    Bit32u i;
    DEV_DATA devData;
    UINT32 mute;
    Bit32u type;
    Bit32u filter;
    
    devData = opn2->_devData;
    mute = 0;
    for (i = 0; i < 7; i++)
        mute |= (opn2->mute[i] << i);
    type = opn2->chip_type;
    filter = opn2->use_filter;
    
    NOPN2_Reset(opn2, opn2->clock, opn2->smplRate);
    
    opn2->_devData = devData;
    nukedopn2_set_mute_mask(opn2, mute);
    opn2->chip_type = type;
    opn2->use_filter = filter;
}